

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O0

int Io_ReadFindCiId(Abc_Ntk_t *pNtk,Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_2c;
  int i;
  Abc_Obj_t *pTemp;
  Abc_Obj_t *pObj_local;
  Abc_Ntk_t *pNtk_local;
  
  local_2c = 0;
  while( true ) {
    iVar1 = Abc_NtkCiNum(pNtk);
    if (iVar1 <= local_2c) {
      return -1;
    }
    pAVar2 = Abc_NtkCi(pNtk,local_2c);
    if (pAVar2 == pObj) break;
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

int Io_ReadFindCiId( Abc_Ntk_t * pNtk, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pTemp;
    int i;
    Abc_NtkForEachCi( pNtk, pTemp, i )
        if ( pTemp == pObj )
            return i;
    return -1;
}